

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetEnumValueInternal
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  uint *puVar1;
  uint uVar2;
  int number;
  OneofDescriptor *oneof_descriptor;
  long lVar3;
  uint32 uVar4;
  ulong uVar5;
  long *plVar6;
  FieldDescriptor *local_30;
  _func_void_FieldDescriptor_ptr *local_28;
  
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar2 = (this->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_28 = FieldDescriptor::TypeOnceInit;
      local_30 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_28,&local_30);
    }
    internal::ExtensionSet::SetEnum
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),number,
               (FieldType)field[0x38],value,field);
  }
  else {
    oneof_descriptor = *(OneofDescriptor **)(field + 0x58);
    if ((oneof_descriptor != (OneofDescriptor *)0x0) &&
       (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >>
                                   4) * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44))) {
      ClearOneof(this,message,oneof_descriptor);
    }
    uVar4 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar4) = value;
    lVar3 = *(long *)(field + 0x58);
    if (lVar3 == 0) {
      uVar5 = (ulong)(uint)(this->schema_).has_bits_offset_;
      if (uVar5 != 0xffffffff) {
        if (field[0x42] == (FieldDescriptor)0x0) {
          plVar6 = (long *)(*(long *)(field + 0x50) + 0x28);
        }
        else if (*(long *)(field + 0x60) == 0) {
          plVar6 = (long *)(*(long *)(field + 0x28) + 0x80);
        }
        else {
          plVar6 = (long *)(*(long *)(field + 0x60) + 0x50);
        }
        uVar2 = (this->schema_).has_bit_indices_
                [(int)((ulong)((long)field - *plVar6) >> 3) * 0x286bca1b];
        puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uVar2 >> 5) * 4 + uVar5);
        *puVar1 = *puVar1 | 1 << ((byte)uVar2 & 0x1f);
      }
    }
    else {
      *(undefined4 *)
       ((long)&(message->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((ulong)(lVar3 - *(long *)(*(long *)(lVar3 + 0x10) + 0x30)) >> 4) *
                     -0x55555554 + (this->schema_).oneof_case_offset_)) =
           *(undefined4 *)(field + 0x44);
    }
  }
  return;
}

Assistant:

void Reflection::SetEnumValueInternal(Message* message,
                                      const FieldDescriptor* field,
                                      int value) const {
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetEnum(field->number(), field->type(), value,
                                          field);
  } else {
    SetField<int>(message, field, value);
  }
}